

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_utils.h
# Opt level: O2

void xray_re::
     trim_container<std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>
               (vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                *container)

{
  pointer ppiVar1;
  ini_section *this;
  pointer ppiVar2;
  _Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  local_48;
  
  ppiVar1 = (container->
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppiVar2 = (container->
                 super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppiVar2 != ppiVar1;
      ppiVar2 = ppiVar2 + 1) {
    this = *ppiVar2;
    if (this != (ini_section *)0x0) {
      xr_ini_file::ini_section::~ini_section(this);
    }
    operator_delete(this,0x38);
  }
  local_48._M_impl.super__Vector_impl_data._M_start =
       (container->
       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (container->
       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (container->
       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (container->
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (container->
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (container->
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void trim_container(T& container)
{
	for (typename T::iterator it = container.begin(), end = container.end(); it != end; ++it)
		delete *it;
	T().swap(container);
}